

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

void __thiscall Centaurus::DFA<wchar_t>::fork_states(DFA<wchar_t> *this,int index,NFA<wchar_t> *nfa)

{
  bool bVar1;
  int dest;
  reference pvVar2;
  IndexVector *pIVar3;
  reference piVar4;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *this_00;
  size_type sVar5;
  reference cc;
  int local_118;
  int i_1;
  int new_index;
  set<int,_std::less<int>,_std::allocator<int>_> ec;
  bool long_flag;
  pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *item;
  iterator __end0_2;
  iterator __begin0_2;
  NFADepartureSet<wchar_t> *__range2_1;
  undefined1 local_b0 [4];
  int initial_index;
  NFADepartureSet<wchar_t> deptset;
  NFATransition<wchar_t> *tr;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range3;
  const_iterator cStack_68;
  int i;
  const_iterator __end0;
  const_iterator __begin0;
  IndexVector *__range2;
  NFADepartureSetFactory<wchar_t> ds_factory;
  NFA<wchar_t> *nfa_local;
  int index_local;
  DFA<wchar_t> *this_local;
  
  ds_factory.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nfa;
  NFADepartureSetFactory<wchar_t>::NFADepartureSetFactory
            ((NFADepartureSetFactory<wchar_t> *)&__range2);
  pvVar2 = std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
           ::operator[](&(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states,(long)index);
  pIVar3 = NFABaseState<wchar_t,_Centaurus::IndexVector>::label
                     (&pvVar2->super_NFABaseState<wchar_t,_Centaurus::IndexVector>);
  __end0 = std::vector<int,_std::allocator<int>_>::begin
                     (&pIVar3->super_vector<int,_std::allocator<int>_>);
  cStack_68 = std::vector<int,_std::allocator<int>_>::end
                        (&pIVar3->super_vector<int,_std::allocator<int>_>);
  while (bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff98), bVar1) {
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end0);
    this_00 = NFA<wchar_t>::get_transitions
                        ((NFA<wchar_t> *)
                         ds_factory.m_transitions.
                         super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,*piVar4);
    __end0_1 = std::
               vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ::begin(this_00);
    tr = (NFATransition<wchar_t> *)
         std::
         vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                               *)&tr), bVar1) {
      deptset.
      super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      .
      super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                    ::operator*(&__end0_1);
      NFADepartureSetFactory<wchar_t>::add
                ((NFADepartureSetFactory<wchar_t> *)&__range2,
                 (NFATransition<wchar_t> *)
                 deptset.
                 super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 .
                 super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  NFADepartureSetFactory<wchar_t>::build_departure_set
            ((NFADepartureSet<wchar_t> *)local_b0,(NFADepartureSetFactory<wchar_t> *)&__range2);
  sVar5 = std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
          ::size(&(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states);
  local_118 = (int)sVar5;
  __end0_2 = std::
             vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::begin((vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      *)&deptset);
  item = (pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
          *)std::
            vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::end((vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   *)&deptset);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_2,
                            (__normal_iterator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                             *)&item), bVar1) {
    cc = __gnu_cxx::
         __normal_iterator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
         ::operator*(&__end0_2);
    ec._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    NFA<wchar_t>::epsilon_closure
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,
               (NFA<wchar_t> *)
               ds_factory.m_transitions.
               super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,&cc->second,
               (bool *)((long)&ec._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    dest = add_state(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&i_1,
                     (bool)(ec._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1));
    pvVar2 = std::
             vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>::
             operator[](&(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states,(long)index);
    NFABaseState<wchar_t,_Centaurus::IndexVector>::add_transition
              (&pvVar2->super_NFABaseState<wchar_t,_Centaurus::IndexVector>,&cc->first,dest,false);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&i_1);
    __gnu_cxx::
    __normal_iterator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::operator++(&__end0_2);
  }
  for (; sVar5 = std::
                 vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                 ::size(&(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states),
      (ulong)(long)local_118 < sVar5; local_118 = local_118 + 1) {
    fork_states(this,local_118,
                (NFA<wchar_t> *)
                ds_factory.m_transitions.
                super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  NFADepartureSet<wchar_t>::~NFADepartureSet((NFADepartureSet<wchar_t> *)local_b0);
  NFADepartureSetFactory<wchar_t>::~NFADepartureSetFactory
            ((NFADepartureSetFactory<wchar_t> *)&__range2);
  return;
}

Assistant:

void fork_states(int index, const NFA<TCHAR>& nfa)
	{
		NFADepartureSetFactory<TCHAR> ds_factory;

		for (int i : m_states[index].label())
		{
			for (const auto& tr : nfa.get_transitions(i))
			{
				ds_factory.add(tr);
			}
		}

		NFADepartureSet<TCHAR> deptset = ds_factory.build_departure_set();

		int initial_index = m_states.size();
		for (const auto& item : deptset)
		{
            bool long_flag = false;
			std::set<int> ec = nfa.epsilon_closure(item.second, long_flag);

			int new_index = add_state(ec, long_flag);

			//std::cout << "S" << index << "->" << new_index << std::endl;

			m_states[index].add_transition(item.first, new_index);
		}

		for (int i = initial_index; i < m_states.size(); i++)
		{
			fork_states(i, nfa);
		}
	}